

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_table.hpp
# Opt level: O0

int __thiscall andyzip::huffman_table<258>::init(huffman_table<258> *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  huffman_table<258> *phVar2;
  uint in_ECX;
  uint16_t *in_RDX;
  uint16_t local_44;
  uint local_38;
  uint local_34;
  uint i_1;
  uint length;
  uint huffcode;
  uint code;
  uint i;
  uint num_lengths_local;
  uint16_t *symbols_local;
  uint8_t *lengths_local;
  huffman_table<258> *this_local;
  
  this->invalid_ = true;
  phVar2 = this;
  if (in_ECX == 1) {
    this->min_length_ = '\0';
    this->max_length_ = '\0';
    this->limits_[0] = 0xffff;
    this->base_[0] = 0;
    this->symbols_[0] = *in_RDX;
    this->invalid_ = false;
  }
  else if (in_ECX == 2) {
    this->min_length_ = '\x01';
    this->max_length_ = '\x01';
    this->limits_[0] = 0xffff;
    this->base_[0] = 0;
    this->symbols_[0] = *in_RDX;
    this->symbols_[1] = in_RDX[1];
    this->invalid_ = false;
  }
  else {
    this->min_length_ = '\x10';
    this->max_length_ = '\0';
    for (huffcode = 0; huffcode != in_ECX; huffcode = huffcode + 1) {
      if (ctx[huffcode] != (EVP_PKEY_CTX)0x0) {
        if ((byte)ctx[huffcode] < this->min_length_) {
          this->min_length_ = (uint8_t)ctx[huffcode];
        }
        if (this->max_length_ < (byte)ctx[huffcode]) {
          this->max_length_ = (uint8_t)ctx[huffcode];
        }
      }
    }
    phVar2 = (huffman_table<258> *)(ulong)this->min_length_;
    if (((this->min_length_ != 0) &&
        (phVar2 = (huffman_table<258> *)(ulong)this->min_length_,
        this->min_length_ <= this->max_length_)) &&
       (phVar2 = (huffman_table<258> *)(ulong)this->max_length_, this->max_length_ < 0x11)) {
      length = 0;
      i_1 = 0;
      for (local_34 = (uint)this->min_length_; local_34 <= this->max_length_;
          local_34 = local_34 + 1) {
        this->base_[local_34 - this->min_length_] = (short)i_1 - (short)length;
        for (local_38 = 0; local_38 != in_ECX; local_38 = local_38 + 1) {
          if ((byte)ctx[local_38] == local_34) {
            if (in_RDX == (uint16_t *)0x0) {
              local_44 = (uint16_t)local_38;
            }
            else {
              local_44 = in_RDX[local_38];
            }
            this->symbols_[length] = local_44;
            i_1 = i_1 + 1;
            length = length + 1;
          }
        }
        this->limits_[local_34 - this->min_length_] =
             (short)(i_1 << (0x10U - (char)local_34 & 0x1f)) - 1;
        uVar1 = (i_1 << (0x10U - (char)local_34 & 0x1f)) - 1;
        phVar2 = (huffman_table<258> *)(ulong)uVar1;
        if (0xffff < uVar1) goto LAB_0010c8e9;
        i_1 = i_1 << 1;
      }
      this->limits_[(int)((this->max_length_ + 1) - (uint)this->min_length_)] = 0xffff;
      this->invalid_ = false;
      phVar2 = this;
    }
  }
LAB_0010c8e9:
  return (int)phVar2;
}

Assistant:

void init(const uint8_t *lengths, const uint16_t *symbols, unsigned num_lengths) {
      invalid_ = true;

      if (num_lengths == 1) {
        min_length_ = 0;
        max_length_ = 0;
        limits_[0] = 0xffff;
        base_[0] = 0;
        symbols_[0] = symbols[0];
        invalid_ = false;
        return;
      }
      if (num_lengths == 2) {
        min_length_ = 1;
        max_length_ = 1;
        limits_[0] = 0xffff;
        base_[0] = 0;
        symbols_[0] = symbols[0];
        symbols_[1] = symbols[1];
        invalid_ = false;
        return;
      }

      min_length_ = 16;
      max_length_ = 0;
      for (unsigned i = 0; i != num_lengths; ++i) {
        if (lengths[i]) {
          if (min_length_ > lengths[i]) min_length_ = lengths[i];
          if (max_length_ < lengths[i]) max_length_ = lengths[i];
        }
      }

      if ( min_length_ <= 0 || min_length_ > max_length_ || max_length_ > 16 ) {
        return;
      }

      unsigned code = 0;
      unsigned huffcode = 0;
      for (unsigned length = min_length_; length <= max_length_; ++length) {
        base_[length-min_length_] = huffcode - code;
        for (unsigned i = 0; i != num_lengths; ++i) {
          if (lengths[i] == length) {
            symbols_[code++] = symbols ? symbols[i] : i;
            huffcode++;
          }
        }
        limits_[length-min_length_] = (uint16_t)( ( huffcode << (16-length) ) - 1 );
        if (( huffcode << (16-length) ) - 1 > 0xffff) {
          return;
        }
        huffcode *= 2;
      }

      // prevent escape from bitstream decoding loop.
      limits_[max_length_+1-min_length_] = 0xffff;
      invalid_ = false;
    }